

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_search.c
# Opt level: O0

int64_t interpolation_filter_rd
                  (MACROBLOCK *x,AV1_COMP *cpi,TileDataEnc *tile_data,BLOCK_SIZE bsize,
                  BUFFER_SET *orig_dst,int64_t *rd,RD_STATS *rd_stats_luma,RD_STATS *rd_stats,
                  int *switchable_rate,BUFFER_SET **dst_bufs,int filter_idx,int *switchable_ctx,
                  int skip_pred)

{
  int_interpfilters iVar1;
  int iVar2;
  int iVar3;
  MACROBLOCKD *xd_00;
  long lVar4;
  long in_RSI;
  MACROBLOCK *in_RDI;
  RD_STATS *in_R8;
  long *in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  int *in_stack_00000018;
  int64_t tmp_rd;
  int64_t tmp_rd_1;
  int plane;
  int tmp_skip_pred;
  int64_t min_rd;
  int tmp_rs;
  int_interpfilters last_best;
  RD_STATS this_rd_stats;
  RD_STATS this_rd_stats_luma;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int num_planes;
  InterpSearchFlags *interp_search_flags;
  AV1_COMMON *cm;
  int local_dc;
  long in_stack_ffffffffffffff30;
  int num_planes_00;
  int in_stack_ffffffffffffff38;
  int local_b0 [2];
  long local_a8;
  undefined1 local_88 [8];
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  BUFFER_SET *in_stack_ffffffffffffff88;
  BLOCK_SIZE in_stack_ffffffffffffff97;
  AV1_COMP *in_stack_ffffffffffffff98;
  MACROBLOCK *x_00;
  int in_stack_ffffffffffffffd8;
  int64_t local_8;
  
  num_planes_00 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  iVar2 = av1_num_planes((AV1_COMMON *)(in_RSI + 0x3bf80));
  x_00 = (MACROBLOCK *)*(in_RDI->e_mbd).mi;
  av1_init_rd_stats((RD_STATS *)local_88);
  memcpy(local_b0,in_stack_00000008,0x28);
  iVar1 = *(int_interpfilters *)((long)&x_00->plane[0].qcoeff + 4);
  *(int_interpfilters *)((long)&x_00->plane[0].qcoeff + 4) = filter_sets[(int)tmp_rd_1];
  iVar3 = get_switchable_rate(in_RDI,*(int_interpfilters *)((long)&x_00->plane[0].qcoeff + 4),_plane
                              ,(uint)*(byte *)(*(long *)(in_RSI + 0x42008) + 0x40));
  xd_00 = (MACROBLOCKD *)((long)iVar3 * (long)in_RDI->rdmult + 0x100 >> 9);
  if (*in_R9 < (long)xd_00) {
    *(int_interpfilters *)((long)&x_00->plane[0].qcoeff + 4) = iVar1;
    local_8 = 0;
  }
  else {
    if ((int)min_rd == *(int *)(in_RSI + 0x9d2f0)) {
      local_dc = 3;
    }
    else {
      local_dc = (int)min_rd;
    }
    switch(local_dc) {
    case 0:
      interp_model_rd_eval
                (x_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff97,in_stack_ffffffffffffff88,
                 in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_R8,in_stack_ffffffffffffffd8
                );
      memcpy(local_b0,local_88,0x28);
    case 1:
      for (in_stack_ffffffffffffff38 = 1;
          num_planes_00 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),
          in_stack_ffffffffffffff38 < iVar2;
          in_stack_ffffffffffffff38 = in_stack_ffffffffffffff38 + 1) {
        in_stack_ffffffffffffff30 =
             ((long)(iVar3 + local_b0[0]) * (long)in_RDI->rdmult + 0x100 >> 9) + local_a8 * 0x80;
        if (*in_R9 <= in_stack_ffffffffffffff30) {
          *(int_interpfilters *)((long)&x_00->plane[0].qcoeff + 4) = iVar1;
          return 0;
        }
        interp_model_rd_eval
                  (x_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff97,
                   in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                   in_R8,in_stack_ffffffffffffffd8);
      }
      break;
    case 2:
      return 0;
    case 3:
      memcpy(local_b0,in_stack_00000010,0x28);
      break;
    default:
      return 0;
    }
    lVar4 = ((long)(iVar3 + local_b0[0]) * (long)in_RDI->rdmult + 0x100 >> 9) + local_a8 * 0x80;
    if (lVar4 < *in_R9) {
      *in_R9 = lVar4;
      *in_stack_00000018 = iVar3;
      if ((int)min_rd != *(int *)(in_RSI + 0x9d2f0)) {
        if ((int)min_rd == 0) {
          memcpy(in_stack_00000008,local_88,0x28);
          memcpy(in_stack_00000010,local_b0,0x28);
          in_RDI->recalc_luma_mc_data = 0;
        }
        else if ((int)min_rd == 1) {
          memcpy(in_stack_00000010,local_b0,0x28);
          in_RDI->recalc_luma_mc_data = in_RDI->recalc_luma_mc_data ^ 1;
        }
        swap_dst_buf(xd_00,(BUFFER_SET **)CONCAT44(local_dc,in_stack_ffffffffffffff38),num_planes_00
                    );
      }
      local_8 = 1;
    }
    else {
      *(int_interpfilters *)((long)&x_00->plane[0].qcoeff + 4) = iVar1;
      local_8 = 0;
    }
  }
  return local_8;
}

Assistant:

static inline int64_t interpolation_filter_rd(
    MACROBLOCK *const x, const AV1_COMP *const cpi,
    const TileDataEnc *tile_data, BLOCK_SIZE bsize,
    const BUFFER_SET *const orig_dst, int64_t *const rd,
    RD_STATS *rd_stats_luma, RD_STATS *rd_stats, int *const switchable_rate,
    const BUFFER_SET *dst_bufs[2], int filter_idx, const int switchable_ctx[2],
    const int skip_pred) {
  const AV1_COMMON *cm = &cpi->common;
  const InterpSearchFlags *interp_search_flags = &cpi->interp_search_flags;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  RD_STATS this_rd_stats_luma, this_rd_stats;

  // Initialize rd_stats structures to default values.
  av1_init_rd_stats(&this_rd_stats_luma);
  this_rd_stats = *rd_stats_luma;
  const int_interpfilters last_best = mbmi->interp_filters;
  mbmi->interp_filters = filter_sets[filter_idx];
  const int tmp_rs =
      get_switchable_rate(x, mbmi->interp_filters, switchable_ctx,
                          cm->seq_params->enable_dual_filter);

  int64_t min_rd = RDCOST(x->rdmult, tmp_rs, 0);
  if (min_rd > *rd) {
    mbmi->interp_filters = last_best;
    return 0;
  }

  (void)tile_data;

  assert(skip_pred != 2);
  assert((rd_stats_luma->rate >= 0) && (rd_stats->rate >= 0));
  assert((rd_stats_luma->dist >= 0) && (rd_stats->dist >= 0));
  assert((rd_stats_luma->sse >= 0) && (rd_stats->sse >= 0));
  assert((rd_stats_luma->skip_txfm == 0) || (rd_stats_luma->skip_txfm == 1));
  assert((rd_stats->skip_txfm == 0) || (rd_stats->skip_txfm == 1));
  assert((skip_pred >= 0) &&
         (skip_pred <= interp_search_flags->default_interp_skip_flags));

  // When skip_txfm pred is equal to default_interp_skip_flags,
  // skip both luma and chroma MC.
  // For mono-chrome images:
  // num_planes = 1 and cpi->default_interp_skip_flags = 1,
  // skip_pred = 1: skip both luma and chroma
  // skip_pred = 0: Evaluate luma and as num_planes=1,
  // skip chroma evaluation
  int tmp_skip_pred =
      (skip_pred == interp_search_flags->default_interp_skip_flags)
          ? INTERP_SKIP_LUMA_SKIP_CHROMA
          : skip_pred;

  switch (tmp_skip_pred) {
    case INTERP_EVAL_LUMA_EVAL_CHROMA:
      // skip_pred = 0: Evaluate both luma and chroma.
      // Luma MC
      interp_model_rd_eval(x, cpi, bsize, orig_dst, AOM_PLANE_Y, AOM_PLANE_Y,
                           &this_rd_stats_luma, 0);
      this_rd_stats = this_rd_stats_luma;
#if CONFIG_COLLECT_RD_STATS == 3
      RD_STATS rd_stats_y;
      av1_pick_recursive_tx_size_type_yrd(cpi, x, &rd_stats_y, bsize,
                                          INT64_MAX);
      PrintPredictionUnitStats(cpi, tile_data, x, &rd_stats_y, bsize);
#endif  // CONFIG_COLLECT_RD_STATS == 3
      AOM_FALLTHROUGH_INTENDED;
    case INTERP_SKIP_LUMA_EVAL_CHROMA:
      // skip_pred = 1: skip luma evaluation (retain previous best luma stats)
      // and do chroma evaluation.
      for (int plane = 1; plane < num_planes; ++plane) {
        int64_t tmp_rd =
            RDCOST(x->rdmult, tmp_rs + this_rd_stats.rate, this_rd_stats.dist);
        if (tmp_rd >= *rd) {
          mbmi->interp_filters = last_best;
          return 0;
        }
        interp_model_rd_eval(x, cpi, bsize, orig_dst, plane, plane,
                             &this_rd_stats, 0);
      }
      break;
    case INTERP_SKIP_LUMA_SKIP_CHROMA:
      // both luma and chroma evaluation is skipped
      this_rd_stats = *rd_stats;
      break;
    case INTERP_EVAL_INVALID:
    default: assert(0); return 0;
  }
  int64_t tmp_rd =
      RDCOST(x->rdmult, tmp_rs + this_rd_stats.rate, this_rd_stats.dist);

  if (tmp_rd < *rd) {
    *rd = tmp_rd;
    *switchable_rate = tmp_rs;
    if (skip_pred != interp_search_flags->default_interp_skip_flags) {
      if (skip_pred == INTERP_EVAL_LUMA_EVAL_CHROMA) {
        // Overwrite the data as current filter is the best one
        *rd_stats_luma = this_rd_stats_luma;
        *rd_stats = this_rd_stats;
        // As luma MC data is computed, no need to recompute after the search
        x->recalc_luma_mc_data = 0;
      } else if (skip_pred == INTERP_SKIP_LUMA_EVAL_CHROMA) {
        // As luma MC data is not computed, update of luma data can be skipped
        *rd_stats = this_rd_stats;
        // As luma MC data is not recomputed and current filter is the best,
        // indicate the possibility of recomputing MC data
        // If current buffer contains valid MC data, toggle to indicate that
        // luma MC data needs to be recomputed
        x->recalc_luma_mc_data ^= 1;
      }
      swap_dst_buf(xd, dst_bufs, num_planes);
    }
    return 1;
  }
  mbmi->interp_filters = last_best;
  return 0;
}